

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)1>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  int iVar1;
  const_iterator copy;
  cell cStack_68;
  
  iVar1 = std::__cxx11::string::compare((char *)&it._M_current[2].val);
  copy._M_current = it._M_current + 1;
  if (iVar1 == 0) {
    copy._M_current = it._M_current;
  }
  cell::cell(&cStack_68,copy._M_current);
  SchemeFrame::setExpression(frame,&cStack_68);
  if (cStack_68.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cStack_68.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&cStack_68.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_68.val._M_dataplus._M_p != &cStack_68.val.field_2) {
    operator_delete(cStack_68.val._M_dataplus._M_p,cStack_68.val.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &conseq = *it; ++it;
		const cell &alt = *it; ++it;
		const cell &test = *it; ++it;
		const cell &if_result = (test.val == "#t") ? conseq : alt;
		frame.setExpression(cell(if_result));
		// Don't move exp_it
		return false;
	}